

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::SolveDirect(TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
              *this,TPZFMatrix<std::complex<float>_> *B,DecomposeType dt,
             list<long,_std::allocator<long>_> *singular)

{
  DecomposeType DVar1;
  DecomposeType in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  
  DVar1 = TPZFrontSym<std::complex<float>_>::GetDecomposeType
                    ((TPZFrontSym<std::complex<float>_> *)(in_RDI + 0x1b));
  if (DVar1 != in_EDX) {
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  (**(code **)(*in_RDI + 0x220))(in_RDI,in_RSI);
  (**(code **)(*in_RDI + 0x228))(in_RDI,in_RSI);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
    if (fFront.GetDecomposeType() != dt) {
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        
        std::stringstream sout;
        B.Print("On input " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Forward(&B);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B.Print("After forward and diagonal " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Backward(&B);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B.Print("Final result " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    return 1;
}